

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q3_K_ref(float *x,block_q3_K *y,int64_t k)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  int j_3;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint8_t *puVar20;
  anon_union_4_2_5fd15f10 fp32_1;
  float fVar21;
  uint uVar22;
  char *pcVar23;
  undefined1 *puVar24;
  uint8_t *puVar25;
  int j;
  long lVar26;
  block_q3_K *pbVar27;
  char *pcVar28;
  int i;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  int iVar32;
  int i_2;
  uint8_t *puVar33;
  ulong uVar34;
  int n_changed;
  bool bVar35;
  short sVar36;
  anon_union_4_2_5fd15f10 fp32;
  float fVar37;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  uint local_188;
  undefined4 uStack_184;
  uint uStack_180;
  uint uStack_17c;
  float afStack_178 [16];
  char local_138 [8];
  undefined8 uStack_130;
  undefined1 local_d8 [136];
  float scales [16];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar38;
  undefined6 uVar39;
  
  auVar15 = _DAT_0014e7b0;
  auVar14 = _DAT_0014e780;
  auVar13 = _DAT_0014e750;
  lVar26 = k + 0xff;
  if (-1 < k) {
    lVar26 = k;
  }
  uVar17 = (uint)((ulong)lVar26 >> 8);
  if (0 < (int)uVar17) {
    puVar25 = y->qs + 0x38;
    puVar33 = y->qs;
    uVar34 = 0;
    do {
      auVar12 = _DAT_0014e730;
      pcVar23 = local_138;
      lVar26 = 0;
      auVar46 = ZEXT816(0);
      pfVar31 = x;
      fVar21 = 0.0;
      fVar37 = 0.0;
      fVar42 = 0.0;
      do {
        lVar19 = lVar26 * 0x10;
        fVar44 = 0.0;
        lVar29 = 0;
        fVar50 = 0.0;
        do {
          fVar49 = ABS(pfVar31[lVar29]);
          fVar51 = fVar49;
          if (fVar49 <= fVar50) {
            fVar51 = fVar50;
          }
          fVar44 = (float)(~-(uint)(fVar50 < fVar49) & (uint)fVar44 |
                          (uint)pfVar31[lVar29] & -(uint)(fVar50 < fVar49));
          lVar29 = lVar29 + 1;
          fVar50 = fVar51;
        } while (lVar29 != 0x10);
        pcVar28 = local_138 + lVar19;
        if (1e-15 <= fVar51) {
          fVar50 = 0.0;
          fVar51 = 0.0;
          lVar29 = 0;
          do {
            fVar49 = pfVar31[lVar29];
            uVar22 = (uint)(12582912.0 - (4.0 / fVar44) * fVar49) & 0x7fffff;
            if (0x400002 < uVar22) {
              uVar22 = 0x400003;
            }
            if (uVar22 < 0x3ffffd) {
              uVar22 = 0x3ffffc;
            }
            fVar48 = (float)(int)(uVar22 - 0x400000);
            pcVar23[lVar29] = (char)uVar22;
            fVar50 = fVar50 + fVar48 * fVar49 * fVar49 * fVar48;
            fVar51 = fVar51 + fVar48 * fVar49 * fVar49 * fVar49;
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x10);
          iVar18 = 0;
          do {
            lVar29 = 0;
            iVar32 = 0;
            do {
              fVar44 = pfVar31[lVar29];
              fVar48 = fVar44 * fVar44;
              fVar52 = (float)(int)pcVar23[lVar29];
              fVar49 = fVar51 - fVar44 * fVar48 * fVar52;
              if (0.0 < fVar49) {
                fVar52 = -fVar48 * fVar52 * fVar52 + fVar50;
                uVar22 = (uint)((fVar44 * fVar52) / fVar49 + 12582912.0) & 0x7fffff;
                if (0x400002 < uVar22) {
                  uVar22 = 0x400003;
                }
                if (uVar22 < 0x3ffffd) {
                  uVar22 = 0x3ffffc;
                }
                if (uVar22 - 0x400000 != (int)pcVar23[lVar29]) {
                  fVar53 = (float)(int)(uVar22 - 0x400000);
                  fVar52 = fVar52 + fVar53 * fVar48 * fVar53;
                  fVar49 = fVar49 + fVar53 * fVar48 * fVar44;
                  if (0.0 < fVar52) {
                    if (fVar51 * fVar51 * fVar52 < fVar49 * fVar49 * fVar50) {
                      pcVar23[lVar29] = (char)uVar22;
                      iVar32 = iVar32 + 1;
                      fVar50 = fVar52;
                      fVar51 = fVar49;
                    }
                  }
                }
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0x10);
          } while ((iVar32 != 0) && (iVar18 = iVar18 + 1, iVar18 != 5));
          cVar1 = *(char *)(&uStack_130 + lVar26 * 2);
          cVar2 = *(char *)((long)&uStack_130 + lVar19 + 1);
          cVar3 = *(char *)((long)&uStack_130 + lVar19 + 2);
          cVar4 = *(char *)((long)&uStack_130 + lVar19 + 3);
          cVar8 = *(char *)((long)&uStack_130 + lVar19 + 4);
          cVar9 = *(char *)((long)&uStack_130 + lVar19 + 5);
          cVar10 = *(char *)((long)&uStack_130 + lVar19 + 6);
          cVar11 = *(char *)((long)&uStack_130 + lVar19 + 7);
          *pcVar28 = *pcVar28 + '\x04';
          local_138[lVar19 + 1] = local_138[lVar19 + 1] + '\x04';
          local_138[lVar19 + 2] = local_138[lVar19 + 2] + '\x04';
          local_138[lVar19 + 3] = local_138[lVar19 + 3] + '\x04';
          local_138[lVar19 + 4] = local_138[lVar19 + 4] + '\x04';
          local_138[lVar19 + 5] = local_138[lVar19 + 5] + '\x04';
          local_138[lVar19 + 6] = local_138[lVar19 + 6] + '\x04';
          local_138[lVar19 + 7] = local_138[lVar19 + 7] + '\x04';
          *(char *)(&uStack_130 + lVar26 * 2) = cVar1 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 1) = cVar2 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 2) = cVar3 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 3) = cVar4 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 4) = cVar8 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 5) = cVar9 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 6) = cVar10 + '\x04';
          *(char *)((long)&uStack_130 + lVar19 + 7) = cVar11 + '\x04';
          fVar50 = fVar51 / fVar50;
        }
        else {
          pcVar28[0] = '\0';
          pcVar28[1] = '\0';
          pcVar28[2] = '\0';
          pcVar28[3] = '\0';
          pcVar28[4] = '\0';
          pcVar28[5] = '\0';
          pcVar28[6] = '\0';
          pcVar28[7] = '\0';
          (&uStack_130)[lVar26 * 2] = 0;
          fVar50 = 0.0;
          fVar51 = 0.0;
        }
        afStack_178[lVar26] = fVar50;
        fVar49 = ABS(fVar50);
        fVar44 = fVar49;
        if (fVar49 <= fVar21) {
          fVar44 = fVar21;
        }
        auVar41._0_4_ = (uint)fVar50 & -(uint)(fVar21 < fVar49);
        auVar41._4_4_ = 0;
        auVar41._8_4_ = (uint)fVar51 & (uint)fVar37;
        auVar41._12_4_ = (uint)fVar51 & (uint)fVar42;
        local_188 = auVar46._0_4_;
        uStack_184 = auVar46._4_4_;
        uStack_180 = auVar46._8_4_;
        uStack_17c = auVar46._12_4_;
        auVar46._0_4_ = ~-(uint)(fVar21 < fVar49) & local_188;
        auVar46._4_4_ = uStack_184;
        auVar46._8_4_ = ~(uint)fVar37 & uStack_180;
        auVar46._12_4_ = ~(uint)fVar42 & uStack_17c;
        auVar46 = auVar46 | auVar41;
        lVar26 = lVar26 + 1;
        pfVar31 = pfVar31 + 0x10;
        pcVar23 = pcVar23 + 0x10;
        fVar21 = fVar44;
        fVar37 = ABS(fVar51);
        fVar42 = ABS(fVar51);
      } while (lVar26 != 0x10);
      pbVar27 = y + uVar34;
      pbVar27->scales[8] = '\0';
      pbVar27->scales[9] = '\0';
      pbVar27->scales[10] = '\0';
      pbVar27->scales[0xb] = '\0';
      pbVar27 = y + uVar34;
      pbVar27->scales[0] = '\0';
      pbVar27->scales[1] = '\0';
      pbVar27->scales[2] = '\0';
      pbVar27->scales[3] = '\0';
      pbVar27->scales[4] = '\0';
      pbVar27->scales[5] = '\0';
      pbVar27->scales[6] = '\0';
      pbVar27->scales[7] = '\0';
      fVar21 = auVar46._0_4_;
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        uVar30 = 0;
        do {
          iVar18 = (int)SUB41(afStack_178[uVar30] * (-32.0 / fVar21) + 12582912.0,0);
          if (0x1e < iVar18) {
            iVar18 = 0x1f;
          }
          if (iVar18 < -0x1f) {
            iVar18 = -0x20;
          }
          if (uVar30 < 8) {
            puVar25[uVar30 + 8] = (byte)iVar18 & 0xf;
          }
          else {
            puVar25[uVar30] = puVar25[uVar30] | (byte)iVar18 << 4;
          }
          y[uVar34].scales[(ulong)((uint)uVar30 & 3) + 8] =
               y[uVar34].scales[(ulong)((uint)uVar30 & 3) + 8] |
               (byte)((iVar18 * 0x100000 + 0x2000000U >> 0x18) <<
                     ((byte)((uVar30 & 0xffffffff) >> 1) & 6));
          uVar30 = uVar30 + 1;
        } while (uVar30 != 0x10);
        fVar37 = 1.0 / (-32.0 / fVar21);
        fVar21 = (float)(((uint)fVar37 & 0x7f800000) + 0x7800000);
        if ((uint)((int)fVar37 * 2) < 0x71000000) {
          fVar21 = 2.0;
        }
        fVar21 = fVar21 + ABS(fVar37) * 5.192297e+33 * 7.70372e-34;
        uVar22 = ((uint)fVar21 & 0xfff) + ((uint)fVar21 >> 0xd & 0x7c00);
        if (0xff000000 < (uint)((int)fVar37 * 2)) {
          uVar22 = 0x7e00;
        }
        uVar22 = uVar22 | (uint)fVar37 >> 0x10 & 0x8000;
      }
      else {
        uVar22 = 0;
      }
      pbVar27 = y + uVar34;
      pbVar27->d = (ggml_half)uVar22;
      fVar21 = ggml_table_f32_f16[uVar22];
      pcVar23 = local_138;
      uVar30 = 0;
      pfVar31 = x;
      do {
        if (uVar30 < 8) {
          bVar16 = y[uVar34].scales[uVar30] & 0xf;
        }
        else {
          bVar16 = y[uVar34].qs[uVar30 + 0x38] >> 4;
        }
        auVar43._0_4_ =
             (float)(int)(char)(((y[uVar34].scales[(ulong)((uint)uVar30 & 3) + 8] >>
                                  ((byte)((uVar30 & 0xffffffff) >> 1) & 6) & 3) << 4 | bVar16) -
                               0x20) * fVar21;
        if ((auVar43._0_4_ != 0.0) || (NAN(auVar43._0_4_))) {
          auVar43._4_4_ = auVar43._0_4_;
          auVar43._8_4_ = auVar43._0_4_;
          auVar43._12_4_ = auVar43._0_4_;
          lVar26 = 0;
          do {
            auVar46 = divps(*(undefined1 (*) [16])(pfVar31 + lVar26),auVar43);
            fVar37 = auVar46._0_4_ + 12582912.0;
            fVar42 = auVar46._4_4_ + 12582912.0;
            auVar45._0_8_ = CONCAT44(fVar42,fVar37) & 0x7fffff007fffff;
            auVar45._8_4_ = (uint)(auVar46._8_4_ + 12582912.0) & 0x7fffff;
            auVar45._12_4_ = (uint)(auVar46._12_4_ + 12582912.0) & 0x7fffff;
            auVar47._0_4_ = -(uint)((int)((uint)fVar37 & 0x7fffff) < auVar13._0_4_);
            auVar47._4_4_ = -(uint)((int)((uint)fVar42 & 0x7fffff) < auVar13._4_4_);
            auVar47._8_4_ = -(uint)((int)auVar45._8_4_ < auVar13._8_4_);
            auVar47._12_4_ = -(uint)((int)auVar45._12_4_ < auVar13._12_4_);
            auVar46 = ~auVar47 & auVar13 | auVar45 & auVar47;
            auVar40._0_4_ = -(uint)(auVar15._0_4_ < auVar46._0_4_);
            auVar40._4_4_ = -(uint)(auVar15._4_4_ < auVar46._4_4_);
            auVar40._8_4_ = -(uint)(auVar15._8_4_ < auVar46._8_4_);
            auVar40._12_4_ = -(uint)(auVar15._12_4_ < auVar46._12_4_);
            auVar46 = (~auVar40 & auVar15 | auVar46 & auVar40) & auVar12;
            sVar5 = auVar46._0_2_;
            cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar46[0] - (0xff < sVar5);
            sVar5 = auVar46._2_2_;
            sVar36 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar46[2] - (0xff < sVar5),cVar1);
            sVar5 = auVar46._4_2_;
            cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar46[4] - (0xff < sVar5);
            sVar5 = auVar46._6_2_;
            uVar38 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar46[6] - (0xff < sVar5),
                              CONCAT12(cVar2,sVar36));
            sVar5 = auVar46._8_2_;
            cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar46[8] - (0xff < sVar5);
            sVar5 = auVar46._10_2_;
            uVar39 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar46[10] - (0xff < sVar5),
                              CONCAT14(cVar3,uVar38));
            sVar5 = auVar46._12_2_;
            cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar46[0xc] - (0xff < sVar5);
            sVar7 = auVar46._14_2_;
            sVar5 = (short)((uint)uVar38 >> 0x10);
            sVar6 = (short)((uint6)uVar39 >> 0x20);
            sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar46[0xe] - (0xff < sVar7),
                                     CONCAT16(cVar4,uVar39)) >> 0x30);
            *(uint *)(pcVar23 + lVar26) =
                 CONCAT13(((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7)) + '\x04',
                          CONCAT12(((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6)) + '\x04'
                                   ,CONCAT11(((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5)
                                             ) + '\x04',
                                             ((0 < sVar36) * (sVar36 < 0x100) * cVar1 -
                                             (0xff < sVar36)) + '\x04')));
            lVar26 = lVar26 + 4;
          } while (lVar26 != 0x10);
        }
        uVar30 = uVar30 + 1;
        pcVar23 = pcVar23 + 0x10;
        pfVar31 = pfVar31 + 0x10;
      } while (uVar30 != 0x10);
      pbVar27->hmask[0x10] = '\0';
      pbVar27->hmask[0x11] = '\0';
      pbVar27->hmask[0x12] = '\0';
      pbVar27->hmask[0x13] = '\0';
      pbVar27->hmask[0x14] = '\0';
      pbVar27->hmask[0x15] = '\0';
      pbVar27->hmask[0x16] = '\0';
      pbVar27->hmask[0x17] = '\0';
      pbVar27->hmask[0x18] = '\0';
      pbVar27->hmask[0x19] = '\0';
      pbVar27->hmask[0x1a] = '\0';
      pbVar27->hmask[0x1b] = '\0';
      pbVar27->hmask[0x1c] = '\0';
      pbVar27->hmask[0x1d] = '\0';
      pbVar27->hmask[0x1e] = '\0';
      pbVar27->hmask[0x1f] = '\0';
      pbVar27->hmask[0] = '\0';
      pbVar27->hmask[1] = '\0';
      pbVar27->hmask[2] = '\0';
      pbVar27->hmask[3] = '\0';
      pbVar27->hmask[4] = '\0';
      pbVar27->hmask[5] = '\0';
      pbVar27->hmask[6] = '\0';
      pbVar27->hmask[7] = '\0';
      pbVar27->hmask[8] = '\0';
      auVar46 = _DAT_0014e770;
      auVar12 = _DAT_0014e5d0;
      pbVar27->hmask[9] = '\0';
      pbVar27->hmask[10] = '\0';
      pbVar27->hmask[0xb] = '\0';
      pbVar27->hmask[0xc] = '\0';
      pbVar27->hmask[0xd] = '\0';
      pbVar27->hmask[0xe] = '\0';
      pbVar27->hmask[0xf] = '\0';
      lVar26 = 0;
      bVar16 = 1;
      iVar18 = 0;
      do {
        cVar1 = local_138[lVar26];
        if ('\x03' < cVar1) {
          pbVar27->hmask[iVar18] = pbVar27->hmask[iVar18] | bVar16;
          local_138[lVar26] = cVar1 + -4;
        }
        iVar32 = iVar18 + 1;
        iVar18 = iVar32;
        if (iVar32 == 0x20) {
          iVar18 = 0;
        }
        bVar16 = bVar16 << (iVar32 == 0x20);
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0x100);
      puVar24 = local_d8;
      puVar20 = puVar33;
      lVar26 = 0;
      do {
        lVar19 = 0;
        do {
          auVar41 = psllw(*(undefined1 (*) [16])(puVar24 + lVar19 + -0x40),2);
          auVar43 = psllw(*(undefined1 (*) [16])(puVar24 + lVar19 + -0x20),4);
          auVar45 = psllw(*(undefined1 (*) [16])(puVar24 + lVar19),6);
          *(undefined1 (*) [16])(puVar20 + lVar19) =
               auVar45 & auVar14 | auVar43 & auVar12 |
               auVar41 & auVar46 | *(undefined1 (*) [16])(puVar24 + lVar19 + -0x60);
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x20);
        puVar24 = puVar24 + 0x80;
        puVar20 = puVar20 + 0x20;
        bVar35 = lVar26 == 0;
        lVar26 = lVar26 + 0x80;
      } while (bVar35);
      x = x + 0x100;
      uVar34 = uVar34 + 1;
      puVar25 = puVar25 + 0x6e;
      puVar33 = puVar33 + 0x6e;
    } while (uVar34 != (uVar17 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q3_K_ref(const float * GGML_RESTRICT x, block_q3_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    int8_t L[QK_K];
    float scales[QK_K / 16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float amax = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            scales[j] = make_q3_quants(16, 4, x + 16*j, L + 16*j, true);
            float scale = fabsf(scales[j]);
            if (scale > amax) {
                amax = scale; max_scale = scales[j];
            }
        }

        memset(y[i].scales, 0, 12);
        if (max_scale) {
            float iscale = -32.f/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int8_t l = nearest_int(iscale*scales[j]);
                l = MAX(-32, MIN(31, l)) + 32;
                if (j < 8) {
                    y[i].scales[j] = l & 0xF;
                } else {
                    y[i].scales[j-8] |= ((l & 0xF) << 4);
                }
                l >>= 4;
                y[i].scales[j%4 + 8] |= (l << (2*(j/4)));
            }
            y[i].d = GGML_FP32_TO_FP16(1/iscale);
        } else {
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }

        int8_t sc;
        for (int j = 0; j < QK_K/16; ++j) {
            sc = j < 8 ? y[i].scales[j] & 0xF : y[i].scales[j-8] >> 4;
            sc = (sc | (((y[i].scales[8 + j%4] >> (2*(j/4))) & 3) << 4)) - 32;
            float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-4, MIN(3, l));
                L[16*j + ii] = l + 4;
            }
        }

        memset(y[i].hmask, 0, QK_K/8);
        // We put the high-bit for the 1st 8 quants into bit 0, the next 8 into bit 1, etc.
        int m = 0;
        uint8_t hm = 1;
        for (int j = 0; j < QK_K; ++j) {
            if (L[j] > 3) {
                y[i].hmask[m] |= hm;
                L[j] -= 4;
            }
            if (++m == QK_K/8) {
                m = 0; hm <<= 1;
            }
        }
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}